

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int mbedtls_constant_time_memcmp(void *v1,void *v2,size_t len)

{
  size_t sVar1;
  byte bVar2;
  
  bVar2 = 0;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    bVar2 = bVar2 | *(byte *)((long)v2 + sVar1) ^ *(byte *)((long)v1 + sVar1);
  }
  return (int)bVar2;
}

Assistant:

static int mbedtls_constant_time_memcmp( const void *v1, const void *v2,
                                         size_t len )
{
    const unsigned char *p1 = (const unsigned char*) v1;
    const unsigned char *p2 = (const unsigned char*) v2;
    size_t i;
    unsigned char diff;

    for( diff = 0, i = 0; i < len; i++ )
        diff |= p1[i] ^ p2[i];

    return( (int)diff );
}